

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_bits.h
# Opt level: O1

void BrotliStoreSyncMetaBlock(size_t *storage_ix,uint8_t *storage)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = *storage_ix;
  *(ulong *)(storage + (uVar1 >> 3)) = 6L << ((byte)uVar1 & 7) | (ulong)storage[uVar1 >> 3];
  uVar2 = (int)uVar1 + 0xd;
  *storage_ix = (ulong)(uVar2 & 0xfffffff8);
  storage[uVar2 >> 3] = '\0';
  return;
}

Assistant:

static BROTLI_INLINE void BrotliWriteBits(size_t n_bits,
                                          uint64_t bits,
                                          size_t * BROTLI_RESTRICT pos,
                                          uint8_t * BROTLI_RESTRICT array) {
#ifdef IS_LITTLE_ENDIAN
  /* This branch of the code can write up to 56 bits at a time,
     7 bits are lost by being perhaps already in *p and at least
     1 bit is needed to initialize the bit-stream ahead (i.e. if 7
     bits are in *p and we write 57 bits, then the next write will
     access a byte that was never initialized). */
  uint8_t *p = &array[*pos >> 3];
  uint64_t v = *p;
#ifdef BIT_WRITER_DEBUG
  printf("WriteBits  %2d  0x%016llx  %10d\n", n_bits, bits, *pos);
#endif
  assert((bits >> n_bits) == 0);
  assert(n_bits <= 56);
  v |= bits << (*pos & 7);
  BROTLI_UNALIGNED_STORE64(p, v);  /* Set some bits. */
  *pos += n_bits;
#else
  /* implicit & 0xff is assumed for uint8_t arithmetics */
  uint8_t *array_pos = &array[*pos >> 3];
  const size_t bits_reserved_in_first_byte = (*pos & 7);
  size_t bits_left_to_write;
  bits <<= bits_reserved_in_first_byte;
  *array_pos++ |= (uint8_t)bits;
  for (bits_left_to_write = n_bits + bits_reserved_in_first_byte;
       bits_left_to_write >= 9;
       bits_left_to_write -= 8) {
    bits >>= 8;
    *array_pos++ = (uint8_t)bits;
  }
  *array_pos = 0;
  *pos += n_bits;
#endif
}